

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSMisc.c
# Opt level: O0

void * calloc_array2(int height,int width,size_t SizeOfElements)

{
  void *__ptr;
  void *pvVar1;
  void **p;
  int ki;
  int i;
  size_t SizeOfElements_local;
  int width_local;
  int height_local;
  
  __ptr = calloc((long)height,8);
  if (__ptr != (void *)0x0) {
    for (p._4_4_ = 0; p._4_4_ < height; p._4_4_ = p._4_4_ + 1) {
      pvVar1 = calloc((long)width,SizeOfElements);
      *(void **)((long)__ptr + (long)p._4_4_ * 8) = pvVar1;
      if (*(long *)((long)__ptr + (long)p._4_4_ * 8) == 0) {
        for (p._0_4_ = 0; (int)p < height; p._0_4_ = (int)p + 1) {
          free(*(void **)((long)__ptr + (long)(int)p * 8));
          *(undefined8 *)((long)__ptr + (long)(int)p * 8) = 0;
        }
        free(__ptr);
        return (void *)0x0;
      }
    }
  }
  return __ptr;
}

Assistant:

void* calloc_array2(int height, int width, size_t SizeOfElements)	
{
	int i = 0, ki = 0;
	void** p = NULL;

	p = (void**)calloc(height, sizeof(void*));
	if (p == NULL)	
	{
		return p;
	}

	for (i = 0; i < height; i++)	
	{
		p[i] = (void*)calloc(width, SizeOfElements);
		if (p[i] == NULL)	
		{
			for (ki = 0; ki < height; ki++)	
			{
				free(p[ki]); p[ki] = NULL;
			}
			free(p); p = NULL;
			return p;
		}
	}

	return p;
}